

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

uint8_t * res_getBinary_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_2_41692a41 *paVar1;
  int32_t *piVar2;
  int32_t iVar3;
  
  if ((res & 0xf0000000) == 0x10000000) {
    if ((res & 0xfffffff) == 0) {
      paVar1 = &gEmpty32;
    }
    else {
      paVar1 = (anon_struct_8_2_41692a41 *)((ulong)((res & 0xfffffff) << 2) + (long)pResData->pRoot)
      ;
    }
    iVar3 = paVar1->length;
    piVar2 = &paVar1->res;
  }
  else {
    iVar3 = 0;
    piVar2 = (int32_t *)0x0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = iVar3;
  }
  return (uint8_t *)piVar2;
}

Assistant:

U_CAPI const uint8_t * U_EXPORT2
res_getBinary(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const uint8_t *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_BINARY) {
        const int32_t *p32= offset==0 ? (const int32_t*)&gEmpty32 : pResData->pRoot+offset;
        length=*p32++;
        p=(const uint8_t *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}